

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcher.cpp
# Opt level: O2

bool __thiscall wmj::fileWatcher::fileWatcher::watchOnce(fileWatcher *this)

{
  int *__buf;
  ssize_t sVar1;
  uint uVar2;
  int *piVar3;
  bool bVar4;
  
  __buf = (int *)operator_new__((this->file_name)._M_string_length * 10 + 0xaa);
  sVar1 = read(this->inotify_fd,__buf,100);
  uVar2 = 0;
  if (0 < sVar1) {
    for (piVar3 = __buf; piVar3 < (int *)((long)__buf + sVar1);
        piVar3 = (int *)((long)piVar3 + (ulong)(uint)piVar3[3] + 0x10)) {
      if (*piVar3 == this->wd) {
        uVar2 = uVar2 | piVar3[1];
      }
    }
    bVar4 = true;
    if ((uVar2 & 0x8008) == 8) goto LAB_00102935;
    if ((uVar2 & 0xc04) != 0) {
      bVar4 = (uVar2 & 0xc00) != 0;
      stopWatch(this);
      startWatch(this);
      goto LAB_00102935;
    }
  }
  bVar4 = false;
LAB_00102935:
  operator_delete__(__buf);
  return bVar4;
}

Assistant:

bool fileWatcher::watchOnce() {
    char *a = new char[(10 * (sizeof(struct inotify_event) + file_name.size() + 1))];
    auto readnum = read(inotify_fd, a, 100);
    if(readnum > 0) {
        unsigned int mask  = 0;
        for(auto c = a; c < a + readnum;) {
            auto event = (struct inotify_event *) c;
            if(event->wd == this->wd) {
                mask |= event->mask;
            }
            c += sizeof(struct inotify_event) + event->len;
        }
        if((mask & IN_IGNORED) == 0 &&
                (mask & IN_CLOSE_WRITE)) {
            // 在文件被写入关闭或者文件被覆盖的时候说明文件被修改
            delete[] a;
            return true;
        } else if(mask & IN_DELETE_SELF  || mask & IN_MOVE_SELF) {
            // 如果你使用mv命令覆盖文件，文件
            // 只是发生了一次没有读入的写,此
            // 时只会触发此处
            stopWatch();
            startWatch();
            delete[] a;
            return true;
        } else if(mask & IN_ATTRIB) {
            // 一些编辑器(比如vim)使用文件覆盖的方法
            // 写入文件，此时需要重新启动一次读
            stopWatch();
            startWatch();
            delete[] a;
            return false;
        }

    }
    delete[] a;
    return false;
}